

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void kratos::topological_sort_helper
               (PackedStructGraph *g,PackedStructNode *node,
               unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
               *visited,queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
                        *queue)

{
  bool bVar1;
  __node_base *this;
  _Node_iterator_base<kratos::PackedStructNode_*,_false> local_68;
  _Node_iterator_base<kratos::PackedStructNode_*,_false> local_60;
  reference local_58;
  PackedStructNode **child;
  iterator __end1;
  iterator __begin1;
  set<kratos::PackedStructNode_*,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  *__range1;
  queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
  *queue_local;
  unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
  *visited_local;
  PackedStructNode *node_local;
  PackedStructGraph *g_local;
  
  visited_local =
       (unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
        *)node;
  node_local = (PackedStructNode *)g;
  std::
  unordered_set<kratos::PackedStructNode*,std::hash<kratos::PackedStructNode*>,std::equal_to<kratos::PackedStructNode*>,std::allocator<kratos::PackedStructNode*>>
  ::emplace<kratos::PackedStructNode*&>
            ((unordered_set<kratos::PackedStructNode*,std::hash<kratos::PackedStructNode*>,std::equal_to<kratos::PackedStructNode*>,std::allocator<kratos::PackedStructNode*>>
              *)visited,(PackedStructNode **)&visited_local);
  this = &(visited_local->_M_h)._M_before_begin;
  __end1 = std::
           set<kratos::PackedStructNode_*,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
           ::begin((set<kratos::PackedStructNode_*,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                    *)this);
  child = (PackedStructNode **)
          std::
          set<kratos::PackedStructNode_*,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
          ::end((set<kratos::PackedStructNode_*,_std::less<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
                 *)this);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&child), bVar1) {
    local_58 = std::_Rb_tree_const_iterator<kratos::PackedStructNode_*>::operator*(&__end1);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
         ::find(visited,local_58);
    local_68._M_cur =
         (__node_type *)
         std::
         unordered_set<kratos::PackedStructNode_*,_std::hash<kratos::PackedStructNode_*>,_std::equal_to<kratos::PackedStructNode_*>,_std::allocator<kratos::PackedStructNode_*>_>
         ::end(visited);
    bVar1 = std::__detail::operator==(&local_60,&local_68);
    if (bVar1) {
      topological_sort_helper((PackedStructGraph *)node_local,*local_58,visited,queue);
    }
    std::_Rb_tree_const_iterator<kratos::PackedStructNode_*>::operator++(&__end1);
  }
  std::
  queue<kratos::PackedStructNode_*,_std::deque<kratos::PackedStructNode_*,_std::allocator<kratos::PackedStructNode_*>_>_>
  ::push(queue,(value_type *)&visited_local);
  return;
}

Assistant:

void topological_sort_helper(PackedStructGraph *g, PackedStructNode *node,
                             std::unordered_set<PackedStructNode *> &visited,
                             std::queue<PackedStructNode *> &queue) {
    // mark it as visited
    visited.emplace(node);

    // visit all the child node
    for (auto const &child : node->children) {
        if (visited.find(child) == visited.end()) {
            // visit it
            topological_sort_helper(g, child, visited, queue);
        }
    }
    queue.push(node);
}